

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O1

int lua_sj_get_label(char *name)

{
  bool bVar1;
  int iVar2;
  aint val;
  char *n;
  aint local_1c;
  char *local_18;
  
  if (name != (char *)0x0) {
    iVar2 = addLuaSourcePositions();
    local_18 = name;
    bVar1 = GetLabelValue(&local_18,&local_1c);
    if (!bVar1) {
      local_1c = -1;
    }
    if (iVar2 != 0) {
      sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
      super__Vector_impl_data._M_finish =
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish + (-1 - (ulong)(iVar2 - 1));
    }
    return local_1c;
  }
  return -1;
}

Assistant:

static int lua_sj_get_label(const char *name) {
	if (nullptr == name) return -1;
	aint val;
	int positionsAdded = addLuaSourcePositions();	// add known script positions to sourcePosStack vector
	char* n = const_cast<char*>(name);	//TODO try to get rid of const_cast, LuaBridge requires const char* to understand it as lua string
	if (!GetLabelValue(n, val)) val = -1;
	removeLuaSourcePositions(positionsAdded);
	return val;
}